

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O0

void __thiscall
FastPForLib::FastPForTest_fastpack_5_except_Test::~FastPForTest_fastpack_5_except_Test
          (FastPForTest_fastpack_5_except_Test *this)

{
  void *in_RDI;
  
  ~FastPForTest_fastpack_5_except_Test((FastPForTest_fastpack_5_except_Test *)0x12e788);
  operator_delete(in_RDI,0x80);
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_5_except) {
    _genDataWithFixBits(in32, 5, 256);
    in32[10] = 10002124;
    in32[77] = 20002124;
    in32[177] = 50002124;
    _verify();
    _copy64();
    _verify64();
  }